

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cubeb_pulse.c
# Opt level: O2

void layout_to_channel_map(cubeb_channel_layout layout,pa_channel_map *cm)

{
  uint uVar1;
  byte bVar2;
  uint32_t i;
  cubeb_channel_layout cVar3;
  ulong uVar4;
  pa_channel_position_t pVar5;
  
  if ((layout == 0) || (cm == (pa_channel_map *)0x0)) {
    __assert_fail("cm && layout != CUBEB_LAYOUT_UNDEFINED",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                  ,0x245,"void layout_to_channel_map(cubeb_channel_layout, pa_channel_map *)");
  }
  (*cubeb_pa_channel_map_init)(cm);
  bVar2 = 0;
  uVar4 = 0;
  for (cVar3 = layout; cVar3 != 0; cVar3 = cVar3 >> 1) {
    if ((cVar3 & 1) != 0) {
      pVar5 = (cVar3 & 1) << (bVar2 & 0x1f);
      if (1 < (uint)(pVar5 + PA_CHANNEL_POSITION_INVALID)) {
        if (pVar5 == 0x20000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_REAR_RIGHT;
        }
        else if (pVar5 == PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER) {
          pVar5 = PA_CHANNEL_POSITION_LFE;
        }
        else if (pVar5 == PA_CHANNEL_POSITION_AUX4) {
          pVar5 = PA_CHANNEL_POSITION_REAR_LEFT;
        }
        else if (pVar5 == PA_CHANNEL_POSITION_AUX20) {
          pVar5 = PA_CHANNEL_POSITION_REAR_RIGHT;
        }
        else if (pVar5 == 0x40) {
          pVar5 = PA_CHANNEL_POSITION_FRONT_LEFT_OF_CENTER;
        }
        else if (pVar5 == 0x80) {
          pVar5 = PA_CHANNEL_POSITION_FRONT_RIGHT_OF_CENTER;
        }
        else if (pVar5 == 0x100) {
          pVar5 = PA_CHANNEL_POSITION_REAR_CENTER;
        }
        else if (pVar5 == 0x200) {
          pVar5 = PA_CHANNEL_POSITION_SIDE_LEFT;
        }
        else if (pVar5 == 0x400) {
          pVar5 = PA_CHANNEL_POSITION_SIDE_RIGHT;
        }
        else if (pVar5 == 0x800) {
          pVar5 = PA_CHANNEL_POSITION_TOP_CENTER;
        }
        else if (pVar5 == 0x1000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_FRONT_LEFT;
        }
        else if (pVar5 == 0x2000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_FRONT_CENTER;
        }
        else if (pVar5 == 0x4000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_FRONT_RIGHT;
        }
        else if (pVar5 == 0x8000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_REAR_LEFT;
        }
        else if (pVar5 == 0x10000) {
          pVar5 = PA_CHANNEL_POSITION_TOP_REAR_CENTER;
        }
        else if (pVar5 == PA_CHANNEL_POSITION_REAR_CENTER) {
          pVar5 = PA_CHANNEL_POSITION_CENTER;
        }
        else {
          pVar5 = PA_CHANNEL_POSITION_INVALID;
        }
      }
      cm->map[uVar4] = pVar5;
      uVar4 = (ulong)((int)uVar4 + 1);
    }
    bVar2 = bVar2 + 1;
  }
  uVar1 = cubeb_channel_layout_nb_channels(layout);
  if (0xff < uVar1) {
    __assert_fail("channels_from_layout <= UINT8_MAX",
                  "/workspace/llm4binary/github/license_c_cmakelists/mozilla[P]cubeb/src/cubeb_pulse.c"
                  ,0x254,"void layout_to_channel_map(cubeb_channel_layout, pa_channel_map *)");
  }
  cm->channels = (uint8_t)uVar1;
  if ((uVar1 == 1) && (cm->map[0] == PA_CHANNEL_POSITION_CENTER)) {
    cm->map[0] = PA_CHANNEL_POSITION_MONO;
  }
  return;
}

Assistant:

static void
layout_to_channel_map(cubeb_channel_layout layout, pa_channel_map * cm)
{
  assert(cm && layout != CUBEB_LAYOUT_UNDEFINED);

  WRAP(pa_channel_map_init)(cm);

  uint32_t channels = 0;
  cubeb_channel_layout channelMap = layout;
  for (uint32_t i = 0; channelMap != 0; ++i) {
    uint32_t channel = (channelMap & 1) << i;
    if (channel != 0) {
      cm->map[channels] = cubeb_channel_to_pa_channel(channel);
      channels++;
    }
    channelMap = channelMap >> 1;
  }
  unsigned int channels_from_layout = cubeb_channel_layout_nb_channels(layout);
  assert(channels_from_layout <= UINT8_MAX);
  cm->channels = (uint8_t)channels_from_layout;

  // Special case single channel center mapping as mono.
  if (cm->channels == 1 && cm->map[0] == PA_CHANNEL_POSITION_FRONT_CENTER) {
    cm->map[0] = PA_CHANNEL_POSITION_MONO;
  }
}